

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O3

void Jf_ManDeriveMapping(Jf_Man_t *p)

{
  int iVar1;
  Jf_Par_t *pJVar2;
  undefined8 uVar3;
  word *pwVar4;
  Vec_Int_t *p_00;
  int *__ptr;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  size_t __size;
  long lVar9;
  Gia_Man_t *pGVar10;
  long lVar11;
  
  pJVar2 = p->pPars;
  if (pJVar2->fCutMin != 0) {
    __assert_fail("!p->pPars->fCutMin",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x60d,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  pGVar10 = p->pGia;
  uVar8 = pGVar10->nObjs;
  iVar5 = (int)pJVar2->Edge + uVar8;
  iVar1 = (int)pJVar2->Area;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < (iVar5 + iVar1 * 2) - 1U) {
    iVar6 = iVar5 + iVar1 * 2;
  }
  p_00->nCap = iVar6;
  if (iVar6 == 0) {
    p_00->pArray = (int *)0x0;
    if ((int)uVar8 < 1) goto LAB_0076633d;
    __size = (ulong)uVar8 * 4;
LAB_0076630e:
    __ptr = (int *)malloc(__size);
LAB_00766316:
    p_00->pArray = __ptr;
    if (__ptr == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar8;
  }
  else {
    __ptr = (int *)malloc((long)iVar6 << 2);
    p_00->pArray = __ptr;
    if (iVar6 < (int)uVar8) {
      __size = (long)(int)uVar8 << 2;
      if (__ptr == (int *)0x0) goto LAB_0076630e;
      __ptr = (int *)realloc(__ptr,__size);
      goto LAB_00766316;
    }
  }
  if (0 < (int)uVar8) {
    memset(__ptr,0,(ulong)uVar8 * 4);
  }
LAB_0076633d:
  p_00->nSize = uVar8;
  if (0 < pGVar10->nObjs) {
    lVar11 = 0;
    do {
      if (pGVar10->pObjs == (Gia_Obj_t *)0x0) break;
      uVar3 = *(undefined8 *)(pGVar10->pObjs + lVar11);
      uVar8 = (uint)uVar3;
      if (((~uVar8 & 0x1fffffff) != 0 && -1 < (int)uVar8) &&
         ((((uVar8 & 0x1fffffff) == 0x1fffffff ||
           ((uVar8 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) &&
          (pGVar10->pRefs[lVar11] != 0)))) {
        if ((p->vCuts).nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar8 = (p->vCuts).pArray[lVar11];
        if (p_00->nSize <= lVar11) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        pwVar4 = (p->pMem).pPages[(int)uVar8 >> ((byte)(p->pMem).nPageSize & 0x1f)];
        lVar9 = (long)(int)(uVar8 & (p->pMem).uPageMask);
        p_00->pArray[lVar11] = p_00->nSize;
        uVar8 = *(uint *)((long)pwVar4 + lVar9 * 8 + 4) & 0xf;
        if ((p->pPars->fCutMin != 0) && (6 < uVar8)) {
          __assert_fail("!p->pPars->fCutMin || Jf_CutSize(pCut) <= 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                        ,0x616,"void Jf_ManDeriveMapping(Jf_Man_t *)");
        }
        Vec_IntPush(p_00,uVar8);
        if ((*(byte *)((long)pwVar4 + lVar9 * 8 + 4) & 0xf) != 0) {
          uVar7 = 0;
          do {
            uVar8 = *(uint *)((long)pwVar4 + uVar7 * 4 + lVar9 * 8 + 8);
            if ((int)uVar8 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12f,"int Abc_Lit2Var(int)");
            }
            Vec_IntPush(p_00,uVar8 >> 1);
            uVar7 = uVar7 + 1;
          } while (uVar7 < (*(uint *)((long)pwVar4 + lVar9 * 8 + 4) & 0xf));
        }
        Vec_IntPush(p_00,(int)lVar11);
        pGVar10 = p->pGia;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < pGVar10->nObjs);
  }
  if ((p_00->nCap != 0x10) && (p_00->nSize != p_00->nCap)) {
    __assert_fail("Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaJf.c"
                  ,0x61c,"void Jf_ManDeriveMapping(Jf_Man_t *)");
  }
  pGVar10->vMapping = p_00;
  return;
}

Assistant:

void Jf_ManDeriveMapping( Jf_Man_t * p )
{
    Vec_Int_t * vMapping;
    Gia_Obj_t * pObj; 
    int i, k, * pCut;
    assert( !p->pPars->fCutMin );
    vMapping = Vec_IntAlloc( Gia_ManObjNum(p->pGia) + (int)p->pPars->Edge + (int)p->pPars->Area * 2 );
    Vec_IntFill( vMapping, Gia_ManObjNum(p->pGia), 0 );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) || Gia_ObjRefNum(p->pGia, pObj) == 0 )
            continue;
        pCut = Jf_ObjCutBest( p, i );
        Vec_IntWriteEntry( vMapping, i, Vec_IntSize(vMapping) );
        assert( !p->pPars->fCutMin || Jf_CutSize(pCut) <= 6 );
        Vec_IntPush( vMapping, Jf_CutSize(pCut) );
        for ( k = 1; k <= Jf_CutSize(pCut); k++ )
            Vec_IntPush( vMapping, Jf_CutVar(pCut, k) );
        Vec_IntPush( vMapping, i );
    }
    assert( Vec_IntCap(vMapping) == 16 || Vec_IntSize(vMapping) == Vec_IntCap(vMapping) );
    p->pGia->vMapping = vMapping;
//    Gia_ManMappingVerify( p->pGia );
}